

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::Image::compressPalette(Image *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  
  if (this->depth == 8) {
    iVar1 = this->height;
    bVar4 = 0 < iVar1;
    if (0 < iVar1) {
      pbVar5 = this->pixels;
      iVar2 = this->width;
      iVar6 = 0;
      do {
        bVar3 = 0 < iVar2;
        if (iVar2 < 1) {
LAB_0010df1b:
          pbVar5 = pbVar5 + this->stride;
        }
        else if (*pbVar5 < 0x10) {
          iVar7 = 0;
          pbVar8 = pbVar5;
          do {
            pbVar8 = pbVar8 + this->bpp;
            if (iVar2 + -1 == iVar7) {
              bVar3 = false;
              goto LAB_0010df1b;
            }
            iVar7 = iVar7 + 1;
          } while (*pbVar8 < 0x10);
          bVar3 = iVar7 < iVar2;
        }
        if (bVar3) {
          if (bVar4) {
            return;
          }
          break;
        }
        iVar6 = iVar6 + 1;
        bVar4 = iVar6 < iVar1;
      } while (iVar6 != iVar1);
    }
    this->depth = 4;
  }
  return;
}

Assistant:

void
Image::compressPalette(void)
{
	if(this->depth != 8)
		return;
	uint8 *pixels = this->pixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < this->width; x++){
			if(*line > 0xF) return;
			line += this->bpp;
		}
		pixels += this->stride;
	}
	this->depth = 4;
}